

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<long,_Js::JitTypePropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<long>(BaseDictionary<long,_Js::JitTypePropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *this,long *key,JitTypePropertyGuard **value)

{
  int iVar1;
  JitTypePropertyGuard **ppJVar2;
  int i;
  JitTypePropertyGuard **value_local;
  long *key_local;
  BaseDictionary<long,_Js::JitTypePropertyGuard_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  iVar1 = FindEntryWithKey<long>(this,key);
  if (-1 < iVar1) {
    ppJVar2 = anon_unknown_4::
              ValueEntry<Js::JitTypePropertyGuard_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_Js::JitTypePropertyGuard_*>_>
              ::Value((ValueEntry<Js::JitTypePropertyGuard_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_Js::JitTypePropertyGuard_*>_>
                       *)(this->entries + iVar1));
    *value = *ppJVar2;
  }
  return -1 < iVar1;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }